

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O0

void __thiscall
CoreML::NeuralNetworkShaper::shapeSimpleRecurrentLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  bool bVar1;
  string *psVar2;
  mapped_type *this_00;
  mapped_type *this_01;
  mapped_type *this_02;
  mapped_type *this_03;
  SimpleRecurrentLayerParams *this_04;
  uint64_t val;
  uint64_t val_00;
  ShapeRange *other;
  size_t outSize;
  size_t inSize;
  SimpleRecurrentLayerParams *recurrent;
  ShapeConstraint *stateOutShape;
  ShapeConstraint *stateInShape;
  ShapeConstraint *outputShape;
  ShapeConstraint *inputShape;
  NeuralNetworkLayer *specLayer_local;
  NeuralNetworkShaper *this_local;
  
  psVar2 = Specification::NeuralNetworkLayer::input_abi_cxx11_(specLayer,0);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,psVar2);
  psVar2 = Specification::NeuralNetworkLayer::output_abi_cxx11_(specLayer,0);
  this_01 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,psVar2);
  psVar2 = Specification::NeuralNetworkLayer::output_abi_cxx11_(specLayer,0);
  ShapeConstraint::setName(this_01,psVar2);
  psVar2 = Specification::NeuralNetworkLayer::input_abi_cxx11_(specLayer,1);
  this_02 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,psVar2);
  psVar2 = Specification::NeuralNetworkLayer::output_abi_cxx11_(specLayer,1);
  this_03 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,psVar2);
  psVar2 = Specification::NeuralNetworkLayer::output_abi_cxx11_(specLayer,1);
  ShapeConstraint::setName(this_03,psVar2);
  this_04 = Specification::NeuralNetworkLayer::simplerecurrent(specLayer);
  val = Specification::SimpleRecurrentLayerParams::inputvectorsize(this_04);
  val_00 = Specification::SimpleRecurrentLayerParams::outputvectorsize(this_04);
  ShapeConstraint::setChannel(this_00,val);
  ShapeConstraint::setHeight(this_00,1);
  ShapeConstraint::setWidth(this_00,1);
  ShapeConstraint::setChannel(this_01,val_00);
  ShapeConstraint::setHeight(this_01,1);
  ShapeConstraint::setWidth(this_01,1);
  bVar1 = Specification::SimpleRecurrentLayerParams::sequenceoutput(this_04);
  if (bVar1) {
    other = ShapeConstraint::sequenceRange(this_00);
    ShapeConstraint::updateSequenceRange(this_01,other);
  }
  else {
    ShapeConstraint::setSequence(this_01,1);
  }
  ShapeConstraint::setSequence(this_02,1);
  ShapeConstraint::setChannel(this_02,val_00);
  ShapeConstraint::setHeight(this_02,1);
  ShapeConstraint::setWidth(this_02,1);
  ShapeConstraint::setSequence(this_03,1);
  ShapeConstraint::setChannel(this_03,val_00);
  ShapeConstraint::setHeight(this_03,1);
  ShapeConstraint::setWidth(this_03,1);
  return;
}

Assistant:

void NeuralNetworkShaper::shapeSimpleRecurrentLayer(const Specification::NeuralNetworkLayer& specLayer) {

    //get the input shape
    ShapeConstraint& inputShape = blobShapes[specLayer.input(0)];
    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));

    ShapeConstraint& stateInShape = blobShapes[specLayer.input(1)];
    ShapeConstraint& stateOutShape = blobShapes[specLayer.output(1)];
    stateOutShape.setName(specLayer.output(1));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Simple Recurrent layer " << specLayer.name() << " input shapes (before): " << std::endl;
    for (int i = 0; i < specLayer.input_size(); i++) {
        std::cout << blobShapes[specLayer.input(i)];
    }
    std::cout << "Simple Recurrent layer " << specLayer.name() << " output shapes (before): " << std::endl;
    for (int i = 0; i < specLayer.output_size(); i++) {
        std::cout << blobShapes[specLayer.output(i)];
    }
#endif

    const Specification::SimpleRecurrentLayerParams& recurrent = specLayer.simplerecurrent();

    size_t inSize = (size_t)recurrent.inputvectorsize();
    size_t outSize = (size_t)recurrent.outputvectorsize();

    inputShape.setChannel(inSize);
    inputShape.setHeight(1);
    inputShape.setWidth(1);

    outputShape.setChannel(outSize);
    outputShape.setHeight(1);
    outputShape.setWidth(1);

    if (recurrent.sequenceoutput()) {
        outputShape.updateSequenceRange(inputShape.sequenceRange());
    }
    else {
        outputShape.setSequence(1);
    }

    stateInShape.setSequence(1);
    stateInShape.setChannel(outSize);
    stateInShape.setHeight(1);
    stateInShape.setWidth(1);

    stateOutShape.setSequence(1);
    stateOutShape.setChannel(outSize);
    stateOutShape.setHeight(1);
    stateOutShape.setWidth(1);

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Simple Recurrent layer " << specLayer.name() << " input shapes (after): " << std::endl;
    for (int i = 0; i < specLayer.input_size(); i++) {
        std::cout << blobShapes[specLayer.input(i)];
    }
    std::cout << "Simple Recurrent layer " << specLayer.name() << " output shapes (after): " << std::endl;
    for (int i = 0; i < specLayer.output_size(); i++) {
        std::cout << blobShapes[specLayer.output(i)];
    }
#endif

}